

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  ResScalar *res;
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 blockA_00;
  long *plVar7;
  ulong size_00;
  ulong size_01;
  ulong size_02;
  LhsScalar *pLVar8;
  RhsScalar *pRVar9;
  LhsScalar *pLVar10;
  RhsScalar *pRVar11;
  ulong *puVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  LhsScalar LStack_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double local_2b0;
  ulong local_2a8;
  double *local_2a0;
  RhsScalar *local_298;
  RhsScalar *local_290;
  RhsScalar *local_288;
  double *local_280;
  RhsScalar *local_278;
  RhsScalar *local_270;
  RhsScalar *local_268;
  double *local_260;
  LhsScalar *local_258;
  LhsScalar *local_250;
  long local_248;
  long local_240;
  long actual_mc;
  long i2;
  long end;
  long start;
  long startTarget;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  double *l;
  double *r;
  double b;
  long s_1;
  long j;
  double a;
  long rs;
  long s;
  long i;
  long k;
  long local_1a0;
  long local_198;
  long actualPanelWidth;
  long k1;
  long local_180;
  long actual_cols;
  long j2;
  long local_168;
  long actual_kc;
  long k2;
  long local_150;
  ulong local_148;
  long subcols;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_128 [4];
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *blockW;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_d8 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeW;
  size_t sizeB;
  size_t sizeA;
  long local_98;
  long mc;
  long kc;
  blas_data_mapper<double,_long,_0> other;
  const_blas_data_mapper<double,_long,_0> tri;
  long cols;
  long otherStride_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_28;
  ulong local_20;
  
  pLVar10 = &LStack_2d8;
  otherSize_local = size;
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,_tri,triStride);
  blas_data_mapper<double,_long,_0>::blas_data_mapper
            ((blas_data_mapper<double,_long,_0> *)&kc,_other,otherStride);
  mc = level3_blocking<double,_double>::kc(blocking);
  sizeA = level3_blocking<double,_double>::mc(blocking);
  plVar7 = std::min<long>(&otherSize_local,(long *)&sizeA);
  lVar1 = mc;
  local_98 = *plVar7;
  size_00 = mc * local_98;
  size_01 = mc * otherSize;
  size_02 = mc * 8;
  local_20 = size_00;
  if (0x1fffffffffffffff < size_00) {
    throw_std_bad_alloc();
  }
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      pLVar10 = (LhsScalar *)((long)&LStack_2d8 - (size_00 * 8 + 0xf & 0xfffffffffffffff0));
      local_258 = pLVar10;
    }
    else {
      local_258 = (LhsScalar *)aligned_malloc(size_00 * 8);
    }
    local_250 = local_258;
  }
  else {
    local_250 = level3_blocking<double,_double>::blockA(blocking);
    pLVar10 = &LStack_2d8;
  }
  blockA_stack_memory_destructor._16_8_ = local_250;
  *(undefined8 *)((long)pLVar10 + -8) = 0x165e6e;
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    local_260 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_260 = (double *)0x0;
  }
  pdVar13 = local_260;
  *(undefined8 *)((long)pLVar10 + -8) = 0x165ec3;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8,pdVar13,size_00,0x20000 < size_00 * 8)
  ;
  local_28 = size_01;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)((long)pLVar10 + -8) = 0x165ee3;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x165ef2;
  pRVar9 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    if (size_01 * 8 < 0x20001) {
      pLVar10 = (LhsScalar *)((long)pLVar10 + -(size_01 * 8 + 0xf & 0xfffffffffffffff0));
      local_270 = pLVar10;
    }
    else {
      *(undefined8 *)((long)pLVar10 + -8) = 0x165f52;
      local_278 = (RhsScalar *)aligned_malloc(size_01 * 8);
      local_270 = local_278;
    }
    local_268 = local_270;
  }
  else {
    *(undefined8 *)((long)pLVar10 + -8) = 0x165f01;
    local_268 = level3_blocking<double,_double>::blockB(blocking);
  }
  blockB_stack_memory_destructor._16_8_ = local_268;
  *(undefined8 *)((long)pLVar10 + -8) = 0x165f90;
  pRVar9 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    local_280 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_280 = (double *)0x0;
  }
  pdVar13 = local_280;
  *(undefined8 *)((long)pLVar10 + -8) = 0x165fde;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW,pdVar13,size_01,0x20000 < size_01 * 8);
  size_local = size_02;
  if (0x1fffffffffffffff < size_02) {
    *(undefined8 *)((long)pLVar10 + -8) = 0x166000;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x16600f;
  pRVar9 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    if ((ulong)(lVar1 << 6) < 0x20001) {
      pLVar10 = (LhsScalar *)((long)pLVar10 + lVar1 * -0x40);
      local_290 = pLVar10;
    }
    else {
      *(undefined8 *)((long)pLVar10 + -8) = 0x16606f;
      local_298 = (RhsScalar *)aligned_malloc(lVar1 << 6);
      local_290 = local_298;
    }
    local_288 = local_290;
  }
  else {
    *(undefined8 *)((long)pLVar10 + -8) = 0x16601e;
    local_288 = level3_blocking<double,_double>::blockW(blocking);
  }
  pRVar9 = local_288;
  *(undefined8 *)((long)pLVar10 + -8) = 0x1660ad;
  pRVar11 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar11 == (RhsScalar *)0x0) {
    local_2a0 = pRVar9;
  }
  else {
    local_2a0 = (double *)0x0;
  }
  pdVar13 = local_2a0;
  *(undefined8 *)((long)pLVar10 + -8) = 0x1660fb;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128,pdVar13,size_02,
             0x20000 < (ulong)(lVar1 << 6));
  *(undefined8 *)((long)pLVar10 + -8) = 0x166112;
  manage_caching_sizes(GetAction,&l2,&subcols);
  if (otherSize < 1) {
    local_2a8 = 0;
  }
  else {
    local_2a8 = (ulong)subcols / (ulong)(otherStride << 5);
  }
  local_148 = local_2a8;
  local_150 = (long)local_2a8 / 4 << 2;
  k2 = 4;
  *(undefined8 *)((long)pLVar10 + -8) = 0x16618b;
  puVar12 = (ulong *)std::max<long>(&local_150,&k2);
  local_148 = *puVar12;
  for (actual_kc = 0; actual_kc < otherSize_local; actual_kc = mc + actual_kc) {
    j2 = otherSize_local - actual_kc;
    *(undefined8 *)((long)pLVar10 + -8) = 0x1661d6;
    plVar7 = std::min<long>(&j2,&mc);
    local_168 = *plVar7;
    for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_148 + actual_cols) {
      k1 = otherSize - actual_cols;
      *(undefined8 *)((long)pLVar10 + -8) = 0x166221;
      plVar7 = std::min<long>(&k1,(long *)&local_148);
      local_180 = *plVar7;
      for (actualPanelWidth = 0; actualPanelWidth < local_168;
          actualPanelWidth = actualPanelWidth + 4) {
        local_1a0 = local_168 - actualPanelWidth;
        k = 4;
        *(undefined8 *)((long)pLVar10 + -8) = 0x16627d;
        plVar7 = std::min<long>(&local_1a0,&k);
        local_198 = *plVar7;
        for (i = 0; lVar1 = actual_cols, i < local_198; i = i + 1) {
          s = actual_kc + actualPanelWidth + i;
          rs = actual_kc + actualPanelWidth;
          a = (double)((local_198 - i) + -1);
          j = 0x3ff0000000000000;
          for (s_1 = actual_cols; lVar14 = s, lVar1 = s_1, s_1 < actual_cols + local_180;
              s_1 = s_1 + 1) {
            b = (double)(s + 1);
            local_2b0 = (double)j;
            *(undefined8 *)((long)pLVar10 + -8) = 0x166365;
            pdVar13 = blas_data_mapper<double,_long,_0>::operator()
                                ((blas_data_mapper<double,_long,_0> *)&kc,lVar14,lVar1);
            lVar1 = s_1;
            dVar2 = b;
            r = (double *)(local_2b0 * *pdVar13);
            *pdVar13 = (double)r;
            *(undefined8 *)((long)pLVar10 + -8) = 0x166394;
            l = blas_data_mapper<double,_long,_0>::operator()
                          ((blas_data_mapper<double,_long,_0> *)&kc,(long)dVar2,lVar1);
            lVar1 = s;
            dVar2 = b;
            *(undefined8 *)((long)pLVar10 + -8) = 0x1663b2;
            i3 = (long)const_blas_data_mapper<double,_long,_0>::operator()
                                 ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,
                                  (long)dVar2,lVar1);
            for (lengthTarget = 0; lengthTarget < (long)a; lengthTarget = lengthTarget + 1) {
              local_2b8 = r;
              pdVar13 = (double *)(i3 + lengthTarget * 8);
              *(undefined8 *)((long)pLVar10 + -8) = 0x166409;
              pdVar13 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar13);
              l[lengthTarget] = -(double)local_2b8 * *pdVar13 + l[lengthTarget];
            }
          }
        }
        startBlock = (local_168 - actualPanelWidth) - local_198;
        lVar14 = actual_kc + actualPanelWidth;
        startTarget = actualPanelWidth;
        local_2c0 = (double *)(blockB_stack_memory_destructor._16_8_ + local_168 * actual_cols * 8);
        blockBOffset = lVar14;
        *(undefined8 *)((long)pLVar10 + -8) = 0x166560;
        pdVar15 = blas_data_mapper<double,_long,_0>::operator()
                            ((blas_data_mapper<double,_long,_0> *)&kc,lVar14,lVar1);
        lVar3 = local_180;
        lVar14 = local_198;
        lVar1 = startTarget;
        pdVar13 = local_2c0;
        *(long *)((long)pLVar10 + -0x10) = local_168;
        *(long *)((long)pLVar10 + -8) = lVar1;
        *(undefined8 *)((long)pLVar10 + -0x18) = 0x1665a3;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)((long)&l1 + 4),pdVar13,pdVar15
                   ,otherStride,lVar14,lVar3,*(long *)((long)pLVar10 + -0x10),
                   *(long *)((long)pLVar10 + -8));
        lVar1 = blockBOffset;
        if (0 < startBlock) {
          lVar14 = actual_kc + actualPanelWidth + local_198;
          local_2c8 = (double *)blockA_stack_memory_destructor._16_8_;
          start = lVar14;
          *(undefined8 *)((long)pLVar10 + -8) = 0x1665fc;
          pdVar15 = const_blas_data_mapper<double,_long,_0>::operator()
                              ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar14,
                               lVar1);
          lVar14 = local_198;
          lVar1 = startBlock;
          pdVar13 = local_2c8;
          *(undefined8 *)((long)pLVar10 + -8) = 0;
          *(undefined8 *)((long)pLVar10 + -0x10) = 0;
          *(undefined8 *)((long)pLVar10 + -0x18) = 0x16663a;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&l1 + 5),pdVar13,
                     pdVar15,triStride,lVar14,lVar1,*(long *)((long)pLVar10 + -0x10),
                     *(long *)((long)pLVar10 + -8));
          lVar14 = actual_cols;
          lVar1 = start;
          *(undefined8 *)((long)pLVar10 + -8) = 0x166657;
          pdVar15 = blas_data_mapper<double,_long,_0>::operator()
                              ((blas_data_mapper<double,_long,_0> *)&kc,lVar1,lVar14);
          uVar6 = blockA_stack_memory_destructor._16_8_;
          lVar5 = local_168;
          lVar4 = local_180;
          lVar3 = local_198;
          lVar14 = startBlock;
          lVar1 = startTarget;
          pdVar13 = (double *)(blockB_stack_memory_destructor._16_8_ + local_168 * actual_cols * 8);
          *(RhsScalar **)((long)pLVar10 + -0x10) = pRVar9;
          *(long *)((long)pLVar10 + -0x18) = lVar1;
          *(long *)((long)pLVar10 + -0x28) = lVar5;
          *(long *)((long)pLVar10 + -0x30) = lVar3;
          *(long *)((long)pLVar10 + -0x38) = lVar4;
          *(long *)((long)pLVar10 + -0x40) = lVar3;
          *(undefined8 *)((long)pLVar10 + -0x20) = 0;
          *(undefined8 *)((long)pLVar10 + -0x48) = 0x1666e2;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&l1 + 6),
                     pdVar15,otherStride,(double *)uVar6,pdVar13,lVar14,
                     *(long *)((long)pLVar10 + -0x40),*(long *)((long)pLVar10 + -0x38),-1.0,
                     *(long *)((long)pLVar10 + -0x30),*(long *)((long)pLVar10 + -0x28),
                     *(long *)((long)pLVar10 + -0x20),*(long *)((long)pLVar10 + -0x18),
                     *(double **)((long)pLVar10 + -0x10));
        }
      }
    }
    i2 = otherSize_local;
    actual_mc = actual_kc + mc;
    end = actual_mc;
    for (; actual_mc < i2; actual_mc = local_98 + actual_mc) {
      local_248 = i2 - actual_mc;
      *(undefined8 *)((long)pLVar10 + -8) = 0x166789;
      plVar7 = std::min<long>(&local_98,&local_248);
      lVar14 = actual_kc;
      lVar1 = actual_mc;
      local_240 = *plVar7;
      if (0 < local_240) {
        local_2d0 = (double *)blockA_stack_memory_destructor._16_8_;
        *(undefined8 *)((long)pLVar10 + -8) = 0x1667c6;
        pdVar15 = const_blas_data_mapper<double,_long,_0>::operator()
                            ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar1,lVar14
                            );
        lVar14 = local_168;
        lVar1 = local_240;
        pdVar13 = local_2d0;
        *(undefined8 *)((long)pLVar10 + -8) = 0;
        *(undefined8 *)((long)pLVar10 + -0x10) = 0;
        *(undefined8 *)((long)pLVar10 + -0x18) = 0x166804;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&l1 + 5),pdVar13,
                   pdVar15,triStride,lVar14,lVar1,*(long *)((long)pLVar10 + -0x10),
                   *(long *)((long)pLVar10 + -8));
        blockA_00 = blockA_stack_memory_destructor._16_8_;
        uVar6 = blockB_stack_memory_destructor._16_8_;
        lVar14 = local_168;
        lVar1 = local_240;
        res = _other + actual_mc;
        *(RhsScalar **)((long)pLVar10 + -0x10) = pRVar9;
        *(long *)((long)pLVar10 + -0x38) = otherSize;
        *(long *)((long)pLVar10 + -0x40) = lVar14;
        *(undefined8 *)((long)pLVar10 + -0x18) = 0;
        *(undefined8 *)((long)pLVar10 + -0x20) = 0;
        *(undefined8 *)((long)pLVar10 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)((long)pLVar10 + -0x30) = 0xffffffffffffffff;
        *(undefined8 *)((long)pLVar10 + -0x48) = 0x16688a;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&l1 + 6),res,
                   otherStride,(double *)blockA_00,(double *)uVar6,lVar1,
                   *(long *)((long)pLVar10 + -0x40),*(long *)((long)pLVar10 + -0x38),-1.0,
                   *(long *)((long)pLVar10 + -0x30),*(long *)((long)pLVar10 + -0x28),
                   *(long *)((long)pLVar10 + -0x20),*(long *)((long)pLVar10 + -0x18),
                   *(double **)((long)pLVar10 + -0x10));
      }
    }
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x1668d6;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128);
  *(undefined8 *)((long)pLVar10 + -8) = 0x1668e2;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW);
  *(undefined8 *)((long)pLVar10 + -8) = 0x1668ee;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }